

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_flash_ff(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b0,ggml_tensor *b1,ggml_tensor *c0,
             ggml_tensor *c1)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  ggml_tensor *in_RCX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *in_R8;
  ggml_tensor *in_R9;
  ggml_tensor *result;
  _Bool is_node;
  undefined8 in_stack_ffffffffffffffb8;
  ggml_context *in_stack_ffffffffffffffc0;
  
  _Var1 = ggml_can_mul_mat(in_RDX,in_RSI);
  if (!_Var1) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x105c,
            "ggml_can_mul_mat(b0, a)");
    abort();
  }
  if ((((in_RSI->grad == (ggml_tensor *)0x0) && (in_RDX->grad == (ggml_tensor *)0x0)) &&
      (in_RCX->grad == (ggml_tensor *)0x0)) &&
     ((in_R8->grad == (ggml_tensor *)0x0 && (in_R9->grad == (ggml_tensor *)0x0)))) {
    pgVar2 = ggml_new_tensor(in_stack_ffffffffffffffc0,
                             (ggml_type)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                             (int)in_stack_ffffffffffffffb8,(int *)0x14e3d7);
    pgVar2->op = GGML_OP_FLASH_FF;
    pgVar2->grad = (ggml_tensor *)0x0;
    pgVar2->src0 = in_RSI;
    pgVar2->src1 = in_RDX;
    pgVar2->opt[0] = in_RCX;
    pgVar2->opt[1] = in_R8;
    pgVar2->opt[2] = in_R9;
    return pgVar2;
  }
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x1062,
          "false");
  abort();
}

Assistant:

struct ggml_tensor * ggml_flash_ff(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b0,
        struct ggml_tensor  * b1,
        struct ggml_tensor  * c0,
        struct ggml_tensor  * c1) {
    GGML_ASSERT(ggml_can_mul_mat(b0, a));
    // TODO: more checks

    bool is_node = false;

    if (a->grad || b0->grad || b1->grad || c0->grad || c1->grad) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    //struct ggml_tensor * result = ggml_dup_tensor(ctx, a);
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, a->ne);

    result->op   = GGML_OP_FLASH_FF;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = b0;
    result->opt[0] = b1;
    result->opt[1] = c0;
    result->opt[2] = c1;

    return result;
}